

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O2

void retro_set_environment(retro_environment_t cb)

{
  _Bool _Var1;
  code *pcVar2;
  _Bool no_rom;
  retro_log_callback logging;
  retro_variable variables [3];
  
  logging.log = (retro_log_printf_t)0x0;
  env_cb = cb;
  _Var1 = (*cb)(0x1b,&logging);
  pcVar2 = (code *)logging;
  if (!_Var1) {
    pcVar2 = fallback_log;
  }
  log_cb = pcVar2;
  gb_log_set_handler(log_handler);
  no_rom = true;
  (*env_cb)(0x12,&no_rom);
  variables[2].key = (char *)0x0;
  variables[2].value = (char *)0x0;
  variables[1].key = "gb_bootrom_skip";
  variables[1].value = "Skip BootROM; false|true";
  variables[0].key = "gb_color";
  variables[0].value = "Screen coloring; Gray|Green";
  (*env_cb)(0x10,variables);
  return;
}

Assistant:

void retro_set_environment(retro_environment_t cb)
{
   env_cb = cb;

   struct retro_log_callback logging = {0};
   if(env_cb(RETRO_ENVIRONMENT_GET_LOG_INTERFACE, &logging))
      log_cb = logging.log;
   else
      log_cb = fallback_log;

   gb_log_set_handler(log_handler);

   bool no_rom = true;
   env_cb(RETRO_ENVIRONMENT_SET_SUPPORT_NO_GAME, &no_rom);

   /// Definition of core variables (aka "Core Options")

   struct retro_variable variables[] =
   {
      { "gb_color", "Screen coloring; Gray|Green" },
      { "gb_bootrom_skip", "Skip BootROM; false|true" },
      { NULL, NULL }
   };

   env_cb(RETRO_ENVIRONMENT_SET_VARIABLES, variables);
}